

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

string * __thiscall
CoreML::dimensionRangesToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *rangePerDimension,
          bool useArrayFormat)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  char *__s;
  undefined1 in_R8B;
  string separator;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  __s = anon_var_dwarf_577538;
  if ((int)rangePerDimension != 0) {
    __s = ", ";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&separator,__s,(allocator<char> *)&local_1d8);
  if ((char)rangePerDimension != '\0') {
    std::operator<<(local_1a8,"[");
  }
  lVar3 = 8;
  for (uVar2 = 0; lVar1 = *(long *)this, uVar2 < (ulong)(*(long *)(this + 8) - lVar1 >> 4);
      uVar2 = uVar2 + 1) {
    rangeToString_abi_cxx11_
              (&local_1d8,*(CoreML **)(lVar1 + -8 + lVar3),*(int64_t *)(lVar1 + lVar3),
               (ulong)rangePerDimension & 0xff,(bool)in_R8B);
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (uVar2 < (*(long *)(this + 8) - *(long *)this >> 4) - 1U) {
      std::operator<<(local_1a8,(string *)&separator);
    }
    lVar3 = lVar3 + 0x10;
  }
  if ((char)rangePerDimension != '\0') {
    std::operator<<(local_1a8,"]");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&separator);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

static std::string dimensionRangesToString(const std::vector<std::pair<int64_t,int64_t>> &rangePerDimension, bool useArrayFormat = false) {
        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " × ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i = 0; i < rangePerDimension.size(); i++) {
            ss << rangeToString(rangePerDimension[i].first,rangePerDimension[i].second,useArrayFormat);
            if (i < rangePerDimension.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }